

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O3

void capnp::_::
     checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<unsigned_char> expected)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  Fault f;
  ulong local_70;
  DebugComparison<unsigned_long,_unsigned_int> _kjCondition;
  ListElementCount local_34;
  
  uVar4 = expected._M_len;
  _kjCondition.right = reader.builder.elementCount;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = reader.builder.elementCount == uVar4;
  if (_kjCondition.result) {
    if (uVar4 != 0) {
      uVar2 = 0;
      uVar3 = 1;
      iVar1 = kj::_::Debug::minSeverity;
      do {
        f.exception._0_1_ = expected._M_array[uVar2];
        local_70 = CONCAT71(local_70._1_7_,reader.builder.ptr[uVar2 * reader.builder.step >> 3]);
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result =
             (uchar)f.exception == reader.builder.ptr[uVar2 * reader.builder.step >> 3];
        if ((!_kjCondition.result) && (iVar1 < 3)) {
          _kjCondition.left = (unsigned_long)&f;
          _kjCondition._8_8_ = &local_70;
          kj::_::Debug::
          log<char_const(&)[28],kj::_::DebugComparison<unsigned_char&,unsigned_char&>&,unsigned_char&,unsigned_char&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", _kjCondition, a, b",
                     (char (*) [28])"failed: expected (a) == (b)",
                     (DebugComparison<unsigned_char_&,_unsigned_char_&> *)&_kjCondition,(uchar *)&f,
                     (uchar *)&local_70);
          iVar1 = kj::_::Debug::minSeverity;
        }
        bVar5 = uVar3 < uVar4;
        uVar2 = uVar3;
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (bVar5);
    }
    return;
  }
  local_34 = reader.builder.elementCount;
  local_70 = uVar4;
  _kjCondition.left = uVar4;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_int>&,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())",
             "_kjCondition,expected.size(), reader.size()",&_kjCondition,&local_70,&local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}